

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint ZSTDMT_computeTargetJobLog(ZSTD_CCtx_params *params)

{
  uint uVar1;
  uint uVar2;
  uint local_24;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint jobLog;
  ZSTD_CCtx_params *params_local;
  
  if ((params->ldmParams).enableLdm == 0) {
    if ((params->cParams).windowLog + 2 < 0x14) {
      local_1c = 0x14;
    }
    else {
      local_1c = (params->cParams).windowLog + 2;
    }
    local_14 = local_1c;
  }
  else {
    if ((params->cParams).chainLog + 4 < 0x15) {
      local_18 = 0x15;
    }
    else {
      local_18 = (params->cParams).chainLog + 4;
    }
    local_14 = local_18;
  }
  uVar1 = MEM_32bits();
  uVar2 = 0x1e;
  if (uVar1 != 0) {
    uVar2 = 0x1d;
  }
  if (local_14 < uVar2) {
    local_24 = local_14;
  }
  else {
    uVar1 = MEM_32bits();
    local_24 = 0x1e;
    if (uVar1 != 0) {
      local_24 = 0x1d;
    }
  }
  return local_24;
}

Assistant:

static unsigned ZSTDMT_computeTargetJobLog(const ZSTD_CCtx_params* params)
{
    unsigned jobLog;
    if (params->ldmParams.enableLdm) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on chainLog instead. */
        jobLog = MAX(21, params->cParams.chainLog + 4);
    } else {
        jobLog = MAX(20, params->cParams.windowLog + 2);
    }
    return MIN(jobLog, (unsigned)ZSTDMT_JOBLOG_MAX);
}